

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_gzip.c
# Opt level: O1

void test_write_filter_gzip(void)

{
  longlong v1;
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  void *pvVar4;
  void *__s;
  archive *paVar5;
  char *pcVar6;
  ssize_t sVar7;
  int64_t iVar8;
  uint uVar9;
  ulong uVar10;
  archive_entry *ae;
  size_t used2;
  size_t used1;
  char path [16];
  archive_entry *local_78;
  void *local_70;
  uint local_68;
  undefined4 uStack_64;
  wchar_t local_5c;
  void *local_58;
  uint local_50;
  undefined4 uStack_4c;
  char local_48 [16];
  longlong local_38;
  
  pvVar4 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                   ,L'/',(uint)(pvVar4 != (void *)0x0),"NULL != (buff = (char *)malloc(buffsize))",
                   (void *)0x0);
  if (pvVar4 == (void *)0x0) {
    return;
  }
  __s = malloc(10000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                   ,L'4',(uint)(__s != (void *)0x0),"NULL != (data = (char *)malloc(datasize))",
                   (void *)0x0);
  if (__s != (void *)0x0) {
    memset(__s,0,10000);
    paVar5 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                     ,L'>',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_ustar(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                        ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar5)
    ;
    wVar2 = archive_write_add_filter_gzip(paVar5);
    if ((wVar2 == L'\0') || (wVar3 = canGzip(), wVar2 == L'\xffffffec' && wVar3 != L'\0')) {
      local_5c = wVar2;
      iVar1 = archive_write_set_bytes_per_block(paVar5,10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'M',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_bytes_per_block(a, 10)",paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'N',1,"ARCHIVE_FILTER_GZIP",(long)iVar1,"archive_filter_code(a, 0)",
                          (void *)0x0);
      pcVar6 = archive_filter_name(paVar5,0);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                 ,L'O',"gzip","\"gzip\"",pcVar6,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
      local_70 = pvVar4;
      iVar1 = archive_write_open_memory(paVar5,pvVar4,2000000,(size_t *)&local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Q',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used1)",paVar5);
      local_78 = archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'R',(uint)(local_78 != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_filetype(local_78,0x8000);
      archive_entry_set_size(local_78,10000);
      uVar10 = 0;
      do {
        sprintf(local_48,"file%03d",uVar10);
        archive_entry_copy_pathname(local_78,local_48);
        iVar1 = archive_write_header(paVar5,local_78);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
        sVar7 = archive_write_data(paVar5,__s,10000);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                         ,L'Z',(uint)(sVar7 == 10000),
                         "datasize == (size_t)archive_write_data(a, data, datasize)",paVar5);
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar9 != 100);
      local_58 = __s;
      archive_entry_free(local_78);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L']',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar5 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'`',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar5);
      iVar1 = archive_read_support_filter_gzip(paVar5);
      if (iVar1 == -0x14) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'd');
        test_skipping(
                     "Can\'t verify gzip writing by reading back; gzip reading not fully supported on this platform"
                     );
      }
      else {
        iVar1 = archive_read_open_memory(paVar5,local_70,CONCAT44(uStack_4c,local_50));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'h',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_read_open_memory(a, buff, used1)",paVar5);
        uVar10 = 0;
        do {
          sprintf(local_48,"file%03d",uVar10);
          iVar1 = archive_read_next_header(paVar5,&local_78);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                                      ,L'l',0,"ARCHIVE_OK",(long)iVar1,
                                      "archive_read_next_header(a, &ae)",(void *)0x0);
          if (wVar2 == L'\0') break;
          pcVar6 = archive_entry_pathname(local_78);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                     ,L'n',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          iVar8 = archive_entry_size(local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                              ,L'o',10000,"(int)datasize",iVar8,"archive_entry_size(ae)",(void *)0x0
                             );
          uVar9 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar9;
        } while (uVar9 != 100);
        iVar1 = archive_read_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
      }
      pvVar4 = local_70;
      iVar1 = archive_read_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'y',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'z',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar5);
      iVar1 = archive_write_set_bytes_per_block(paVar5,10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'|',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_bytes_per_block(a, 10)",paVar5);
      local_38 = -0x14;
      if (local_5c == L'\0') {
        local_38 = 0;
      }
      wVar2 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'~',local_38,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)wVar2,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_set_options(paVar5,"gzip:nonexistent-option=0");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x80',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                          "archive_write_set_options(a, \"gzip:nonexistent-option=0\")",paVar5);
      iVar1 = archive_write_set_options(paVar5,"gzip:compression-level=1");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_options(a, \"gzip:compression-level=1\")",paVar5);
      iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","9");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")",
                          paVar5);
      iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","abc");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x86',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                          "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")"
                          ,paVar5);
      iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","99");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x88',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                          "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")",
                          paVar5);
      iVar1 = archive_write_set_options(paVar5,"gzip:compression-level=9");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x8a',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_options(a, \"gzip:compression-level=9\")",paVar5);
      iVar1 = archive_write_open_memory(paVar5,pvVar4,2000000,(size_t *)&local_68);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x8b',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used2)",paVar5);
      pvVar4 = local_58;
      uVar10 = 0;
      do {
        sprintf(local_48,"file%03d",uVar10);
        local_78 = archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                         ,L'\x8e',(uint)(local_78 != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_copy_pathname(local_78,local_48);
        archive_entry_set_size(local_78,10000);
        archive_entry_set_filetype(local_78,0x8000);
        iVar1 = archive_write_header(paVar5,local_78);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'\x92',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5
                           );
        sVar7 = archive_write_data(paVar5,pvVar4,10000);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                         ,L'\x93',(uint)(sVar7 == 10000),
                         "datasize == (size_t)archive_write_data(a, data, datasize)",paVar5);
        archive_entry_free(local_78);
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar9 != 100);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x96',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'\x97',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar5 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'¡',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'¢',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar5);
      iVar1 = archive_read_support_filter_gzip(paVar5);
      if ((local_5c == L'\0') && (iVar1 != 0)) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'¥');
        test_skipping("gzip reading not fully supported on this platform");
      }
      else {
        iVar1 = archive_read_support_filter_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'¨',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                            paVar5);
        iVar1 = archive_read_open_memory(paVar5,local_70,CONCAT44(uStack_64,local_68));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'ª',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_read_open_memory(a, buff, used2)",paVar5);
        uVar10 = 0;
        do {
          sprintf(local_48,"file%03d",uVar10);
          iVar1 = archive_read_next_header(paVar5,&local_78);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                                      ,L'®',0,"ARCHIVE_OK",(long)iVar1,
                                      "archive_read_next_header(a, &ae)",(void *)0x0);
          if (wVar2 == L'\0') break;
          pcVar6 = archive_entry_pathname(local_78);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                     ,L'°',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          iVar8 = archive_entry_size(local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                              ,L'±',10000,"(int)datasize",iVar8,"archive_entry_size(ae)",
                              (void *)0x0);
          uVar9 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar9;
        } while (uVar9 != 100);
        iVar1 = archive_read_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'³',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
      }
      iVar1 = archive_read_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'µ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'º',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'»',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar5);
      iVar1 = archive_write_set_bytes_per_block(paVar5,10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'½',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_bytes_per_block(a, 10)",paVar5);
      wVar2 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'¿',local_38,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)wVar2,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_set_filter_option(paVar5,(char *)0x0,"compression-level","1");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Á',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_filter_option(a, NULL, \"compression-level\", \"1\")",
                          paVar5);
      iVar1 = archive_write_open_memory(paVar5,local_70,2000000,(size_t *)&local_68);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ã',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used2)",paVar5);
      pvVar4 = local_58;
      uVar10 = 0;
      do {
        sprintf(local_48,"file%03d",uVar10);
        local_78 = archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                         ,L'Æ',(uint)(local_78 != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_copy_pathname(local_78,local_48);
        archive_entry_set_size(local_78,10000);
        archive_entry_set_filetype(local_78,0x8000);
        iVar1 = archive_write_header(paVar5,local_78);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
        failure("Writing file %s",local_48);
        sVar7 = archive_write_data(paVar5,pvVar4,10000);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'Í',10000,"datasize",sVar7,
                            "(size_t)archive_write_data(a, data, datasize)",paVar5);
        archive_entry_free(local_78);
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar9 != 100);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ð',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ñ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      failure("Compression-level=1 wrote %d bytes; default wrote %d bytes",(ulong)local_68,
              (ulong)local_50);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'Ö',(uint)(CONCAT44(uStack_4c,local_50) < CONCAT44(uStack_64,local_68)),
                       "used2 > used1",(void *)0x0);
      paVar5 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'Ø',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ù',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar5);
      iVar1 = archive_read_support_filter_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar5);
      iVar1 = archive_read_support_filter_gzip(paVar5);
      if (iVar1 == -0x14) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'Ý');
        test_skipping("gzip reading not fully supported on this platform");
      }
      else {
        iVar1 = archive_read_open_memory(paVar5,local_70,CONCAT44(uStack_64,local_68));
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'à',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_read_open_memory(a, buff, used2)",paVar5);
        uVar10 = 0;
        do {
          sprintf(local_48,"file%03d",uVar10);
          iVar1 = archive_read_next_header(paVar5,&local_78);
          wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                                      ,L'ä',0,"ARCHIVE_OK",(long)iVar1,
                                      "archive_read_next_header(a, &ae)",(void *)0x0);
          if (wVar2 == L'\0') break;
          pcVar6 = archive_entry_pathname(local_78);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                     ,L'æ',local_48,"path",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
          iVar8 = archive_entry_size(local_78);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                              ,L'ç',10000,"(int)datasize",iVar8,"archive_entry_size(ae)",
                              (void *)0x0);
          uVar9 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar9;
        } while (uVar9 != 100);
        iVar1 = archive_read_close(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                            ,L'é',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
      }
      iVar1 = archive_read_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ë',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'ñ',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      wVar2 = archive_write_add_filter_gzip(paVar5);
      v1 = local_38;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ó',local_38,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)wVar2,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ô',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'ö',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      wVar2 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ø',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)wVar2,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ù',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ú',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'ü',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ý',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar5);
      wVar2 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ÿ',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)wVar2,
                          "archive_write_add_filter_gzip(a)",paVar5);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ā',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ā',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar5 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                       ,L'ă',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ą',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar5);
      wVar2 = archive_write_add_filter_gzip(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ć',v1,"(use_prog)?ARCHIVE_WARN:ARCHIVE_OK",(long)wVar2,
                          "archive_write_add_filter_gzip(a)",paVar5);
      __s = local_70;
      iVar1 = archive_write_open_memory(paVar5,local_70,2000000,(size_t *)&local_68);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'ć',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used2)",paVar5);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                          ,L'Ĉ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
      wVar2 = L'ĉ';
      pvVar4 = local_58;
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                     ,L'E');
      test_skipping("gzip writing not supported on this platform");
      wVar2 = L'F';
    }
    iVar1 = archive_write_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_gzip.c"
                        ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    free(pvVar4);
    pvVar4 = __s;
  }
  free(pvVar4);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_gzip)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r, use_prog = 0;

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_gzip(a);
	if (r != ARCHIVE_OK) {
		if (canGzip() && r == ARCHIVE_WARN)
			use_prog = 1;
		else {
			skipping("gzip writing not supported on this platform");
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			free(data);
			return;
		}
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_GZIP, archive_filter_code(a, 0));
	assertEqualString("gzip", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("Can't verify gzip writing by reading back;"
		    " gzip reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_options(a, "gzip:nonexistent-option=0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "gzip:compression-level=1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "gzip:compression-level=9"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Curiously, this test fails; the test data above compresses
	 * better at default compression than at level 9. */
	/*
	failure("compression-level=9 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);
	*/

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r != ARCHIVE_OK && !use_prog) {
		skipping("gzip reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Level 1 really does result in larger data. */
	failure("Compression-level=1 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_write_add_filter_gzip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}